

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int MRIStepGetDky(void *arkode_mem,realtype t,int k,N_Vector dky)

{
  double dVar1;
  double dVar2;
  int error_code;
  char *msgfmt;
  double dVar3;
  
  if (arkode_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::MRIStep","MRIStepGetDky",
                    "arkode_mem = NULL illegal.");
    return -0x15;
  }
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
  }
  else {
    if (dky == (N_Vector)0x0) {
      msgfmt = "dky = NULL illegal.";
      error_code = -0x1a;
      goto LAB_003ed398;
    }
    if (*(ARKInterp *)((long)arkode_mem + 0x148) != (ARKInterp)0x0) {
      dVar1 = *(double *)((long)arkode_mem + 0x198);
      dVar2 = *(double *)((long)arkode_mem + 0x238);
      dVar3 = (ABS(dVar2) + ABS(dVar1)) * *(double *)((long)arkode_mem + 8) * 100.0;
      dVar3 = (double)(-(ulong)(dVar2 < 0.0) & (ulong)-dVar3 | ~-(ulong)(dVar2 < 0.0) & (ulong)dVar3
                      );
      if (0.0 < (t - (dVar3 + dVar1)) * (t - ((dVar1 - dVar2) - dVar3))) {
        arkProcessError((ARKodeMem)arkode_mem,-0x19,"ARKode","arkGetDky",
                        "Illegal value for t.t = %lg is not between tcur - hold = %lg and tcur = %lg."
                       );
        return -0x19;
      }
      error_code = arkInterpEvaluate(arkode_mem,*(ARKInterp *)((long)arkode_mem + 0x148),
                                     (t - dVar1) / *(double *)((long)arkode_mem + 0x168),k,5,dky);
      if (error_code == 0) {
        return 0;
      }
      msgfmt = "Error calling arkInterpEvaluate";
      goto LAB_003ed398;
    }
    msgfmt = "Missing interpolation structure";
  }
  error_code = -0x15;
LAB_003ed398:
  arkProcessError((ARKodeMem)arkode_mem,error_code,"ARKode","arkGetDky",msgfmt);
  return error_code;
}

Assistant:

int MRIStepGetDky(void *arkode_mem, realtype t, int k, N_Vector dky)
{
  /* unpack ark_mem, call arkGetDky, and return */
  int retval;
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::MRIStep",
                    "MRIStepGetDky", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  SUNDIALS_MARK_FUNCTION_BEGIN(ARK_PROFILER);
  retval = arkGetDky(ark_mem, t, k, dky);
  SUNDIALS_MARK_FUNCTION_END(ARK_PROFILER);
  return(retval);
}